

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O2

TimingControl * __thiscall
slang::ast::PrimitiveInstanceSymbol::getDelay(PrimitiveInstanceSymbol *this)

{
  optional<const_slang::ast::TimingControl_*> *this_00;
  Scope *pSVar1;
  SyntaxNode *pSVar2;
  SourceLocation SVar3;
  TimingControl *pTVar4;
  TimingControl **ppTVar5;
  _Storage<const_slang::ast::TimingControl_*,_true> _Var6;
  LookupLocation LVar7;
  ASTContext context;
  ASTContext local_58;
  undefined4 extraout_var;
  
  this_00 = &this->delay;
  if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged == true) {
LAB_00222317:
    pTVar4 = (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>).
             _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload.
             _M_value;
  }
  else {
    pSVar1 = (this->super_InstanceSymbolBase).super_Symbol.parentScope;
    pSVar2 = (this->super_InstanceSymbolBase).super_Symbol.originatingSyntax;
    if ((pSVar2 == (SyntaxNode *)0x0 || pSVar1 == (Scope *)0x0) ||
       (pSVar2->parent == (SyntaxNode *)0x0)) {
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
    }
    else {
      LVar7 = LookupLocation::before((Symbol *)this);
      local_58.lookupIndex = LVar7.index;
      local_58.flags.m_bits = 0x20;
      local_58.instanceOrProc = (Symbol *)0x0;
      local_58.firstTempVar = (TempVarSymbol *)0x0;
      local_58.randomizeDetails = (RandomizeDetails *)0x0;
      local_58.assertionInstance = (AssertionInstanceDetails *)0x0;
      pSVar2 = pSVar2->parent;
      local_58.scope.ptr = pSVar1;
      if (pSVar2->kind == HierarchyInstantiation) {
        if (*(ParameterValueAssignmentSyntax **)(pSVar2 + 4) !=
            (ParameterValueAssignmentSyntax *)0x0) {
          pTVar4 = Delay3Control::fromParams
                             (pSVar1->compilation,*(ParameterValueAssignmentSyntax **)(pSVar2 + 4),
                              &local_58);
          if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
              _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged
              == false) {
            (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
                 true;
          }
          (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>)._M_payload.
          super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
               pTVar4;
          ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::value(this_00);
          if ((*ppTVar5)->kind == Delay3) {
            ppTVar5 = std::optional<const_slang::ast::TimingControl_*>::value(this_00);
            SVar3 = (*ppTVar5)[1].sourceRange.startLoc;
            if (SVar3 != (SourceLocation)0x0) {
              ASTContext::addDiag(&local_58,(DiagCode)0x1d0005,*(SourceRange *)((long)SVar3 + 0x20))
              ;
            }
          }
          goto LAB_00222317;
        }
      }
      else if (pSVar2[4].parent != (SyntaxNode *)0x0) {
        _Var6._0_4_ = TimingControl::bind((int)pSVar2[4].parent,(sockaddr *)&local_58,
                                          local_58.lookupIndex);
        _Var6._4_4_ = extraout_var;
        if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
            _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
            false) {
          (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged =
               true;
        }
        (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>)._M_payload.
        super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload = _Var6;
        return _Var6._M_value;
      }
      if ((this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>.
          _M_payload.super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged ==
          false) {
        (this->delay).super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>._M_payload
        .super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_engaged = true;
      }
      (this_00->super__Optional_base<const_slang::ast::TimingControl_*,_true,_true>)._M_payload.
      super__Optional_payload_base<const_slang::ast::TimingControl_*>._M_payload._M_value =
           (TimingControl *)0x0;
    }
    pTVar4 = (TimingControl *)0x0;
  }
  return pTVar4;
}

Assistant:

const TimingControl* PrimitiveInstanceSymbol::getDelay() const {
    if (delay)
        return *delay;

    auto scope = getParentScope();
    auto syntax = getSyntax();
    if (!scope || !syntax || !syntax->parent) {
        delay = nullptr;
        return nullptr;
    }

    ASTContext context(*scope, LookupLocation::before(*this), ASTFlags::NonProcedural);

    auto& parent = *syntax->parent;
    if (parent.kind == SyntaxKind::HierarchyInstantiation) {
        if (auto params = parent.as<HierarchyInstantiationSyntax>().parameters) {
            delay = &Delay3Control::fromParams(scope->getCompilation(), *params, context);
            if (delay.value()->kind == TimingControlKind::Delay3) {
                if (auto d3 = delay.value()->as<Delay3Control>().expr3)
                    context.addDiag(diag::Delay3UdpNotAllowed, d3->sourceRange);
            }
            return *delay;
        }
    }
    else {
        auto delaySyntax = parent.as<PrimitiveInstantiationSyntax>().delay;
        if (delaySyntax) {
            delay = &TimingControl::bind(*delaySyntax, context);
            return *delay;
        }
    }

    delay = nullptr;
    return nullptr;
}